

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_storage.c
# Opt level: O3

int psa_is_key_present_in_storage(psa_key_file_id_t key)

{
  psa_status_t pVar1;
  psa_storage_info_t data_identifier_info;
  psa_storage_info_t pStack_8;
  
  pVar1 = psa_its_get_info((ulong)key,&pStack_8);
  return (int)(pVar1 != -0x8c);
}

Assistant:

int psa_is_key_present_in_storage( const psa_key_file_id_t key )
{
    psa_status_t ret;
    psa_storage_uid_t data_identifier = psa_its_identifier_of_slot( key );
    struct psa_storage_info_t data_identifier_info;

    ret = psa_its_get_info( data_identifier, &data_identifier_info );

    if( ret == PSA_ERROR_DOES_NOT_EXIST )
        return( 0 );
    return( 1 );
}